

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::doTargetTooHigh(Session *this,Message *msg)

{
  SessionState *this_00;
  IntTConvertor<unsigned_long> *this_01;
  FieldBase *pFVar1;
  FieldBase *this_02;
  IntTConvertor<unsigned_long> *pIVar2;
  long *plVar3;
  undefined8 *puVar4;
  uint64_t msgSeqNum;
  IntTConvertor<unsigned_long> *pIVar5;
  ulong *puVar6;
  size_type *psVar7;
  unsigned_long value;
  unsigned_long value_00;
  unsigned_long value_01;
  ulong uVar8;
  undefined8 uVar9;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  unsigned_long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  FieldBase *local_38;
  
  pFVar1 = FieldMap::getFieldRef(&(msg->m_header).super_FieldMap,8);
  this_02 = FieldMap::getFieldRef(&(msg->m_header).super_FieldMap,0x22);
  this_00 = &this->m_state;
  pIVar2 = (IntTConvertor<unsigned_long> *)SessionState::getNextTargetMsgSeqNum(this_00);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_78,pIVar2,value);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1d0efc);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_c8 = *puVar6;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar6;
    local_d8 = (ulong *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
  puVar6 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar6) {
    local_e8 = *puVar6;
    uStack_e0 = puVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar6;
    local_f8 = (ulong *)*puVar4;
  }
  local_f0 = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_38 = pFVar1;
  pIVar2 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)this_02);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_98,pIVar2,value_00);
  uVar8 = 0xf;
  if (local_f8 != &local_e8) {
    uVar8 = local_e8;
  }
  if (uVar8 < local_98._M_string_length + local_f0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar9 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_98._M_string_length + local_f0) goto LAB_001a88cf;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_001a88cf:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_98._M_dataplus._M_p);
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar7 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_b8.field_2._M_allocated_capacity = *psVar7;
    local_b8.field_2._8_8_ = puVar4[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar7;
    local_b8._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_b8._M_string_length = puVar4[1];
  *puVar4 = psVar7;
  puVar4[1] = 0;
  *(undefined1 *)psVar7 = 0;
  SessionState::onEvent(this_00,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  msgSeqNum = UInt64Field::getValue((UInt64Field *)this_02);
  SessionState::queue(this_00,msgSeqNum,msg);
  pIVar2 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.first;
  this_01 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.second;
  if (((pIVar2 == (IntTConvertor<unsigned_long> *)0x0 &&
        this_01 == (IntTConvertor<unsigned_long> *)0x0) ||
      (this->m_sendRedundantResendRequests != false)) ||
     (pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)this_02),
     pIVar5 < pIVar2)) {
    generateResendRequest(this,(BeginString *)local_38,(MsgSeqNum *)this_02);
    return;
  }
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_98,pIVar2,value_01);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x1d1181);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_78.field_2._M_allocated_capacity = *psVar7;
    local_78.field_2._8_8_ = plVar3[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar7;
    local_78._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_78._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_c8 = *puVar6;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar6;
    local_d8 = (ulong *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_58,this_01,local_d0);
  uVar8 = 0xf;
  if (local_d8 != &local_c8) {
    uVar8 = local_c8;
  }
  if (uVar8 < local_58._M_string_length + local_d0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      uVar9 = local_58.field_2._M_allocated_capacity;
    }
    if (local_58._M_string_length + local_d0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_d8);
      goto LAB_001a8b87;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_58._M_dataplus._M_p);
LAB_001a8b87:
  puVar6 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar6) {
    local_e8 = *puVar6;
    uStack_e0 = puVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar6;
    local_f8 = (ulong *)*puVar4;
  }
  local_f0 = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)puVar6 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_b8.field_2._M_allocated_capacity = *psVar7;
    local_b8.field_2._8_8_ = plVar3[3];
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar7;
    local_b8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  SessionState::onEvent(this_00,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    return;
  }
  operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void Session::doTargetTooHigh(const Message &msg) {
  const Header &header = msg.getHeader();
  auto const &beginString = header.getField<BeginString>();
  auto const &msgSeqNum = header.getField<MsgSeqNum>();

  m_state.onEvent(
      "MsgSeqNum too high, expecting " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum()) + " but received "
      + SEQNUM_CONVERTOR::convert(msgSeqNum));

  m_state.queue(msgSeqNum, msg);

  if (m_state.resendRequested()) {
    SessionState::ResendRange range = m_state.resendRange();

    if (!m_sendRedundantResendRequests && msgSeqNum >= range.first) {
      m_state.onEvent(
          "Already sent ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(range.first)
          + " TO: " + SEQNUM_CONVERTOR::convert(range.second) + ".  Not sending another.");
      return;
    }
  }

  generateResendRequest(beginString, msgSeqNum);
}